

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::argument_loader<Strider*,unsigned_int,float,float,int,int,int,int,float,float>::
load_impl_sequence<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul>
          (argument_loader<Strider*,unsigned_int,float,float,int,int,int,int,float,float> *this,
          long call)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  long lVar9;
  undefined8 local_40;
  undefined1 local_38;
  bool local_37;
  
  bVar1 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 0x28),(PyObject *)**(undefined8 **)(call + 8),
                     (bool)((byte)**(undefined4 **)(call + 0x20) & 1));
  bVar2 = type_caster<unsigned_int,_void>::load
                    ((type_caster<unsigned_int,_void> *)(this + 0x20),
                     *(PyObject **)(*(long *)(call + 8) + 8),
                     SUB41((**(uint **)(call + 0x20) & 2) >> 1,0));
  bVar3 = type_caster<float,_void>::load
                    ((type_caster<float,_void> *)(this + 0x1c),
                     *(PyObject **)(*(long *)(call + 8) + 0x10),
                     SUB41((**(uint **)(call + 0x20) & 4) >> 2,0));
  bVar4 = type_caster<float,_void>::load
                    ((type_caster<float,_void> *)(this + 0x18),
                     *(PyObject **)(*(long *)(call + 8) + 0x18),
                     SUB41((**(uint **)(call + 0x20) & 8) >> 3,0));
  bVar5 = type_caster<int,_void>::load
                    ((type_caster<int,_void> *)(this + 0x14),
                     *(PyObject **)(*(long *)(call + 8) + 0x20),
                     SUB41((**(uint **)(call + 0x20) & 0x10) >> 4,0));
  bVar6 = type_caster<int,_void>::load
                    ((type_caster<int,_void> *)(this + 0x10),
                     *(PyObject **)(*(long *)(call + 8) + 0x28),
                     SUB41((**(uint **)(call + 0x20) & 0x20) >> 5,0));
  bVar7 = type_caster<int,_void>::load
                    ((type_caster<int,_void> *)(this + 0xc),
                     *(PyObject **)(*(long *)(call + 8) + 0x30),
                     SUB41((**(uint **)(call + 0x20) & 0x40) >> 6,0));
  bVar8 = type_caster<int,_void>::load
                    ((type_caster<int,_void> *)(this + 8),*(PyObject **)(*(long *)(call + 8) + 0x38)
                     ,(bool)(**(byte **)(call + 0x20) >> 7));
  local_40 = CONCAT26(CONCAT11(bVar8,bVar7),
                      CONCAT24(CONCAT11(bVar6,bVar5),
                               CONCAT13(bVar4,CONCAT12(bVar3,CONCAT11(bVar2,bVar1)))));
  local_38 = type_caster<float,_void>::load
                       ((type_caster<float,_void> *)(this + 4),
                        *(PyObject **)(*(long *)(call + 8) + 0x40),
                        (bool)((byte)((uint)**(undefined4 **)(call + 0x20) >> 8) & 1));
  local_37 = type_caster<float,_void>::load
                       ((type_caster<float,_void> *)this,*(PyObject **)(*(long *)(call + 8) + 0x48),
                        (bool)((byte)(**(uint **)(call + 0x20) >> 9) & 1));
  lVar9 = 0;
  do {
    if (*(char *)((long)&local_40 + lVar9) != '\x01') {
      return (bool)*(char *)((long)&local_40 + lVar9);
    }
    bVar1 = lVar9 != 9;
    lVar9 = lVar9 + 1;
  } while (bVar1);
  return true;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }